

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

bool crnd::crnd_create_segmented_file
               (void *pData,uint32 data_size,void *pBase_data,uint base_data_size)

{
  undefined1 uVar1;
  ushort uVar2;
  uint i_1;
  uint32 uVar3;
  uint uVar4;
  crn_header *pcVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  
  if (((0x3d < data_size && pData != (void *)0x0) &&
      (pcVar5 = crnd_get_header(pData,data_size), pcVar5 != (crn_header *)0x0)) &&
     (((pcVar5->m_flags).m_buf[1] & 1) == 0)) {
    uVar3 = crnd_get_segmented_file_size(pData,data_size);
    if (base_data_size < uVar3) {
      return uVar3 <= base_data_size;
    }
    memcpy(pBase_data,pData,(ulong)uVar3);
    uVar4 = (uint)*(byte *)((long)pBase_data + 0x14) << 0x10 |
            (uint)*(byte *)((long)pBase_data + 0x13) << 0x18 | 0x10000;
    lVar8 = 0;
    do {
      *(char *)((long)pBase_data + lVar8 + 0x13) = (char)(uVar4 >> 0x18);
      uVar4 = uVar4 << 8;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    lVar8 = 0;
    do {
      *(char *)((long)pBase_data + lVar8 + 6) = (char)(uVar3 >> 0x18);
      uVar3 = uVar3 << 8;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    uVar1 = *(undefined1 *)((long)pBase_data + 2);
    uVar2 = CONCAT11(uVar1,*(undefined1 *)((long)pBase_data + 3));
    uVar4 = *(uint *)((long)pBase_data + 6);
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    if (uVar4 == uVar2) {
      iVar7 = 0;
    }
    else {
      uVar6 = 0xffff;
      lVar8 = 0;
      do {
        uVar9 = (uint)(uVar6 >> 8) & 0xff ^ (uint)*(byte *)((long)pBase_data + lVar8 + (ulong)uVar2)
        ;
        uVar9 = uVar9 >> 4 ^ uVar9;
        uVar9 = uVar9 << 0xc ^ uVar9 << 5 ^ ((int)uVar6 << 8 | uVar9);
        uVar6 = (ulong)uVar9;
        lVar8 = lVar8 + 1;
      } while (uVar4 - uVar2 != (int)lVar8);
      iVar7 = ~uVar9 << 0x10;
    }
    lVar8 = 0;
    do {
      *(char *)((long)pBase_data + lVar8 + 10) = (char)((uint)iVar7 >> 0x18);
      iVar7 = iVar7 << 8;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    uVar4 = (uint)CONCAT11(uVar1,*(undefined1 *)((long)pBase_data + 3));
    if (uVar4 == 6) {
      iVar7 = 0;
    }
    else {
      uVar6 = 0xffff;
      lVar8 = 6;
      do {
        uVar9 = (uint)(uVar6 >> 8) & 0xff ^ (uint)*(byte *)((long)pBase_data + lVar8);
        uVar9 = uVar9 >> 4 ^ uVar9;
        uVar9 = uVar9 << 0xc ^ uVar9 << 5 ^ ((int)uVar6 << 8 | uVar9);
        uVar6 = (ulong)uVar9;
        lVar8 = lVar8 + 1;
      } while (uVar4 != (uint)lVar8);
      iVar7 = ~uVar9 << 0x10;
    }
    lVar8 = 0;
    do {
      *(char *)((long)pBase_data + lVar8 + 4) = (char)((uint)iVar7 >> 0x18);
      iVar7 = iVar7 << 8;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    return true;
  }
  return false;
}

Assistant:

bool crnd_create_segmented_file(const void* pData, uint32 data_size, void* pBase_data, uint base_data_size)
    {
        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return false;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return false;

        if (pHeader->m_flags & cCRNHeaderFlagSegmented)
            return false;

        const uint actual_base_data_size = crnd_get_segmented_file_size(pData, data_size);
        if (base_data_size < actual_base_data_size)
            return false;

        memcpy(pBase_data, pData, actual_base_data_size);

        crn_header& new_header = *static_cast<crn_header*>(pBase_data);
        new_header.m_flags = new_header.m_flags | cCRNHeaderFlagSegmented;
        new_header.m_data_size = actual_base_data_size;

        new_header.m_data_crc16 = crc16((const uint8*)pBase_data + new_header.m_header_size, new_header.m_data_size - new_header.m_header_size);

        new_header.m_header_crc16 = crc16(&new_header.m_data_size, new_header.m_header_size - (uint32)((const uint8*)&new_header.m_data_size - (const uint8*)&new_header));

        CRND_ASSERT(crnd_validate_file(&new_header, actual_base_data_size, NULL));

        return true;
    }